

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_manager.cpp
# Opt level: O0

Type * __thiscall spvtools::opt::analysis::TypeManager::GetType(TypeManager *this,uint32_t id)

{
  bool bVar1;
  reference pvVar2;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
  local_40;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
  local_38;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
  local_30;
  _Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
  local_28;
  const_iterator iter;
  uint32_t id_local;
  TypeManager *this_local;
  
  iter.
  super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>.
  _M_cur._4_4_ = id;
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
       ::find(&this->id_to_type_,
              (key_type *)
              ((long)&iter.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                      ._M_cur + 4));
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
       ::end(&this->id_to_type_);
  bVar1 = std::__detail::operator!=(&local_28,&local_30);
  if (bVar1) {
    pvVar2 = std::__detail::
             _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>
             ::operator*((_Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>
                          *)&local_28);
    this_local = (TypeManager *)pvVar2->second;
  }
  else {
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
         ::find(&this->id_to_incomplete_type_,
                (key_type *)
                ((long)&iter.
                        super__Node_iterator_base<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false>
                        ._M_cur + 4));
    local_28._M_cur = local_38._M_cur;
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<unsigned_int,_spvtools::opt::analysis::Type_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>_>_>
         ::end(&this->id_to_incomplete_type_);
    bVar1 = std::__detail::operator!=(&local_28,&local_40);
    if (bVar1) {
      pvVar2 = std::__detail::
               _Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>
               ::operator*((_Node_const_iterator<std::pair<const_unsigned_int,_spvtools::opt::analysis::Type_*>,_false,_false>
                            *)&local_28);
      this_local = (TypeManager *)pvVar2->second;
    }
    else {
      this_local = (TypeManager *)0x0;
    }
  }
  return (Type *)this_local;
}

Assistant:

Type* TypeManager::GetType(uint32_t id) const {
  auto iter = id_to_type_.find(id);
  if (iter != id_to_type_.end()) return (*iter).second;
  iter = id_to_incomplete_type_.find(id);
  if (iter != id_to_incomplete_type_.end()) return (*iter).second;
  return nullptr;
}